

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::Boxed_Number::go<long,unsigned_char>
          (Boxed_Number *this,Opers t_oper,Boxed_Value *t_bv,long *t_lhs,long *c_lhs,uchar *c_rhs)

{
  byte bVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ulong uVar4;
  undefined8 *puVar5;
  arithmetic_error *paVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  bool b;
  Boxed_Value BVar8;
  string local_48;
  
  switch(t_oper) {
  case equals:
    b = *c_lhs == (ulong)*c_rhs;
    goto LAB_0031fbe7;
  case less_than:
    b = *c_lhs < (long)(ulong)*c_rhs;
    goto LAB_0031fbe7;
  case greater_than:
    b = (long)(ulong)*c_rhs < *c_lhs;
    goto LAB_0031fbe7;
  case less_than_equal:
    b = *c_lhs <= (long)(ulong)*c_rhs;
    goto LAB_0031fbe7;
  case greater_than_equal:
    b = (long)(ulong)*c_rhs <= *c_lhs;
    goto LAB_0031fbe7;
  case not_equal:
    b = *c_lhs != (ulong)*c_rhs;
LAB_0031fbe7:
    BVar8 = const_var((chaiscript *)this,b);
    _Var7._M_pi = BVar8.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    goto LAB_0031fc07;
  default:
    if (t_lhs == (long *)0x0) {
switchD_0031fc58_caseD_7:
      puVar5 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar5 = &PTR__bad_cast_003f7e20;
      __cxa_throw(puVar5,&detail::exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t_bv;
    switch(t_oper) {
    case assign:
      uVar4 = (ulong)*c_rhs;
      goto LAB_0031fcd9;
    default:
      goto switchD_0031fc58_caseD_7;
    case assign_product:
      uVar4 = (ulong)*c_rhs * *t_lhs;
      goto LAB_0031fcd9;
    case assign_sum:
      *t_lhs = *t_lhs + (ulong)*c_rhs;
      break;
    case assign_quotient:
      check_divide_by_zero<unsigned_char>(*c_rhs);
      uVar4 = *t_lhs / (long)(ulong)*c_rhs;
      _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(*t_lhs % (long)(ulong)*c_rhs);
      goto LAB_0031fcd9;
    case assign_difference:
      *t_lhs = *t_lhs - (ulong)*c_rhs;
      break;
    case assign_bitwise_and:
      check_divide_by_zero<unsigned_char>(*c_rhs);
      uVar4 = (ulong)((uint)*c_rhs & (uint)*t_lhs);
      _Var7._M_pi = extraout_RDX;
LAB_0031fcd9:
      *t_lhs = uVar4;
      break;
    case assign_bitwise_or:
      *t_lhs = *t_lhs | (ulong)*c_rhs;
      break;
    case assign_shift_left:
      *t_lhs = *t_lhs << (*c_rhs & 0x3f);
      break;
    case assign_shift_right:
      *t_lhs = *t_lhs >> (*c_rhs & 0x3f);
      break;
    case assign_remainder:
      bVar1 = *c_rhs;
      lVar2 = *t_lhs;
      *t_lhs = lVar2 % (long)(ulong)bVar1;
      _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(lVar2 % (long)(ulong)bVar1);
      break;
    case assign_bitwise_xor:
      *t_lhs = *t_lhs ^ (ulong)*c_rhs;
    }
    (this->bv).m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (t_bv->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var3 = (t_bv->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->bv).m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var3;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    goto LAB_0031fc07;
  case shift_left:
    local_48._M_dataplus._M_p = (pointer)(*c_lhs << (*c_rhs & 0x3f));
    break;
  case shift_right:
    local_48._M_dataplus._M_p = (pointer)(*c_lhs >> (*c_rhs & 0x3f));
    break;
  case remainder:
    if ((ulong)*c_rhs == 0) {
      paVar6 = (arithmetic_error *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      local_48.field_2._M_allocated_capacity._0_6_ = 0x656469766964;
      local_48.field_2._M_allocated_capacity._6_2_ = 0x6220;
      local_48.field_2._8_6_ = 0x6f72657a2079;
      local_48._M_string_length = 0xe;
      local_48.field_2._M_local_buf[0xe] = '\0';
      exception::arithmetic_error::arithmetic_error(paVar6,&local_48);
      __cxa_throw(paVar6,&exception::arithmetic_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_48._M_dataplus._M_p = (pointer)(*c_lhs % (long)(ulong)*c_rhs);
    break;
  case bitwise_and:
    local_48._M_dataplus._M_p = (pointer)(ulong)((uint)*c_rhs & (uint)*c_lhs);
    break;
  case bitwise_or:
    local_48._M_dataplus._M_p = (pointer)((ulong)*c_rhs | *c_lhs);
    break;
  case bitwise_xor:
    local_48._M_dataplus._M_p = (pointer)((ulong)*c_rhs ^ *c_lhs);
    break;
  case sum:
    local_48._M_dataplus._M_p = (pointer)((ulong)*c_rhs + *c_lhs);
    break;
  case quotient:
    if ((ulong)*c_rhs == 0) {
      paVar6 = (arithmetic_error *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      local_48.field_2._M_allocated_capacity._0_6_ = 0x656469766964;
      local_48.field_2._M_allocated_capacity._6_2_ = 0x6220;
      local_48.field_2._8_6_ = 0x6f72657a2079;
      local_48._M_string_length = 0xe;
      local_48.field_2._M_local_buf[0xe] = '\0';
      exception::arithmetic_error::arithmetic_error(paVar6,&local_48);
      __cxa_throw(paVar6,&exception::arithmetic_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_48._M_dataplus._M_p = (pointer)(*c_lhs / (long)(ulong)*c_rhs);
    break;
  case product:
    local_48._M_dataplus._M_p = (pointer)((ulong)*c_rhs * *c_lhs);
    break;
  case difference:
    local_48._M_dataplus._M_p = (pointer)(*c_lhs - (ulong)*c_rhs);
  }
  BVar8 = detail::const_var_impl<long>((detail *)this,(long *)&local_48);
  _Var7._M_pi = BVar8.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
LAB_0031fc07:
  BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var7._M_pi;
  BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto go(Operators::Opers t_oper, const Boxed_Value &t_bv, LHS *t_lhs, const LHS &c_lhs, const RHS &c_rhs) {
      switch (t_oper) {
        case Operators::Opers::equals:
          return const_var(c_lhs == c_rhs);
        case Operators::Opers::less_than:
          return const_var(c_lhs < c_rhs);
        case Operators::Opers::greater_than:
          return const_var(c_lhs > c_rhs);
        case Operators::Opers::less_than_equal:
          return const_var(c_lhs <= c_rhs);
        case Operators::Opers::greater_than_equal:
          return const_var(c_lhs >= c_rhs);
        case Operators::Opers::not_equal:
          return const_var(c_lhs != c_rhs);
        case Operators::Opers::sum:
          return const_var(c_lhs + c_rhs);
        case Operators::Opers::quotient:
          check_divide_by_zero(c_rhs);
          return const_var(c_lhs / c_rhs);
        case Operators::Opers::product:
          return const_var(c_lhs * c_rhs);
        case Operators::Opers::difference:
          return const_var(c_lhs - c_rhs);
        default:
          break;
      }

      if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
        switch (t_oper) {
          case Operators::Opers::shift_left:
            return const_var(c_lhs << c_rhs);
          case Operators::Opers::shift_right:
            return const_var(c_lhs >> c_rhs);
          case Operators::Opers::remainder:
            check_divide_by_zero(c_rhs);
            return const_var(c_lhs % c_rhs);
          case Operators::Opers::bitwise_and:
            return const_var(c_lhs & c_rhs);
          case Operators::Opers::bitwise_or:
            return const_var(c_lhs | c_rhs);
          case Operators::Opers::bitwise_xor:
            return const_var(c_lhs ^ c_rhs);
          default:
            break;
        }
      }

      if (t_lhs) {
        switch (t_oper) {
          case Operators::Opers::assign:
            *t_lhs = c_rhs;
            return t_bv;
          case Operators::Opers::assign_product:
            *t_lhs *= c_rhs;
            return t_bv;
          case Operators::Opers::assign_sum:
            *t_lhs += c_rhs;
            return t_bv;
          case Operators::Opers::assign_quotient:
            check_divide_by_zero(c_rhs);
            *t_lhs /= c_rhs;
            return t_bv;
          case Operators::Opers::assign_difference:
            *t_lhs -= c_rhs;
            return t_bv;
          default:
            break;
        }

        if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
          switch (t_oper) {
            case Operators::Opers::assign_bitwise_and:
              check_divide_by_zero(c_rhs);
              *t_lhs &= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_or:
              *t_lhs |= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_left:
              *t_lhs <<= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_right:
              *t_lhs >>= c_rhs;
              return t_bv;
            case Operators::Opers::assign_remainder:
              *t_lhs %= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_xor:
              *t_lhs ^= c_rhs;
              return t_bv;
            default:
              break;
          }
        }
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }